

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

void remove_option(mtree_option **global,char *value,size_t len)

{
  mtree_option *pmVar1;
  int iVar2;
  mtree_option *pmVar3;
  mtree_option *__ptr;
  char *__s1;
  
  pmVar1 = (mtree_option *)0x0;
  __ptr = (mtree_option *)global;
  do {
    pmVar3 = pmVar1;
    __ptr = __ptr->next;
    if (__ptr == (mtree_option *)0x0) {
      return;
    }
    __s1 = __ptr->value;
    iVar2 = strncmp(__s1,value,len);
    pmVar1 = __ptr;
  } while ((iVar2 != 0) || ((__s1[len] != '=' && (__s1[len] != '\0'))));
  if (pmVar3 == (mtree_option *)0x0) {
    *global = __ptr->next;
    __s1 = __ptr->value;
  }
  else {
    pmVar3->next = __ptr->next;
  }
  free(__s1);
  free(__ptr);
  return;
}

Assistant:

static void
remove_option(struct mtree_option **global, const char *value, size_t len)
{
	struct mtree_option *iter, *last;

	last = NULL;
	for (iter = *global; iter != NULL; last = iter, iter = iter->next) {
		if (strncmp(iter->value, value, len) == 0 &&
		    (iter->value[len] == '\0' ||
		     iter->value[len] == '='))
			break;
	}
	if (iter == NULL)
		return;
	if (last == NULL)
		*global = iter->next;
	else
		last->next = iter->next;

	free(iter->value);
	free(iter);
}